

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifras.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  char *pcVar1;
  ostream *poVar2;
  long lVar3;
  size_t sVar4;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var5;
  MemoryManager *this;
  clock_t cVar6;
  Node *pNVar7;
  clock_t cVar8;
  int iVar9;
  void *__ptr;
  ulong uVar10;
  vector<long,_std::allocator<long>_> basics_v;
  long target;
  long number;
  char *endptr;
  list<long,_std::allocator<long>_> basics;
  _List_base<const_Operation_*,_std::allocator<const_Operation_*>_> local_78;
  set<std::__cxx11::list<long,_std::allocator<long>_>,_std::less<std::__cxx11::list<long,_std::allocator<long>_>_>,_std::allocator<std::__cxx11::list<long,_std::allocator<long>_>_>_>
  explored_nodes;
  
  basics_v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  basics_v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  basics_v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (argc < 4) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," num num... target");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar9 = -1;
  }
  else {
    for (uVar10 = 1; (uint)argc != uVar10; uVar10 = uVar10 + 1) {
      lVar3 = strtol(argv[uVar10],&endptr,0);
      pcVar1 = endptr;
      __s = argv[uVar10];
      number = lVar3;
      sVar4 = strlen(__s);
      if (pcVar1 != __s + sVar4) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Error: \"");
        poVar2 = std::operator<<(poVar2,argv[uVar10]);
        poVar2 = std::operator<<(poVar2,"\" not a number.");
        std::endl<char,std::char_traits<char>>(poVar2);
        iVar9 = -2;
        goto LAB_001064f4;
      }
      if (lVar3 < 1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "Error: numbers below or equal to zero are not allowed.");
        std::endl<char,std::char_traits<char>>(poVar2);
        iVar9 = -3;
        goto LAB_001064f4;
      }
      std::vector<long,_std::allocator<long>_>::push_back(&basics_v,&number);
    }
    lVar3 = basics_v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish[-1];
    basics_v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = basics_v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_equals_val<long_const>>
                      (basics_v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start);
    if (_Var5._M_current ==
        basics_v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::
      __sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<long>>>
                (basics_v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start);
      std::__cxx11::list<long,std::allocator<long>>::
      list<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,void>
                ((list<long,std::allocator<long>> *)&basics,
                 (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                 basics_v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                 basics_v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish,(allocator_type *)&explored_nodes);
      this = MemoryManager::instance();
      explored_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &explored_nodes._M_t._M_impl.super__Rb_tree_header._M_header;
      explored_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      explored_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      explored_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      explored_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           explored_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      cVar6 = clock();
      local_78._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_78;
      local_78._M_impl._M_node._M_size = 0;
      local_78._M_impl._M_node.super__List_node_base._M_prev =
           local_78._M_impl._M_node.super__List_node_base._M_next;
      pNVar7 = MemoryManager::build_node
                         (this,(list<const_Operation_*,_std::allocator<const_Operation_*>_> *)
                               local_78._M_impl._M_node.super__List_node_base._M_next,0,lVar3,
                          &basics,&explored_nodes,(Node *)0x0);
      std::__cxx11::_List_base<const_Operation_*,_std::allocator<const_Operation_*>_>::_M_clear
                (&local_78);
      cVar8 = clock();
      operator<<((ostream *)&std::cout,pNVar7->best_child);
      std::operator<<((ostream *)&std::cout,"Elapsed time: ");
      poVar2 = std::ostream::_M_insert<double>((double)(cVar8 - cVar6) / 1000000.0);
      poVar2 = std::operator<<(poVar2," seconds");
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout,"Explored nodes: ");
      __ptr = (void *)explored_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      MemoryManager::free(this,__ptr);
      std::
      _Rb_tree<std::__cxx11::list<long,_std::allocator<long>_>,_std::__cxx11::list<long,_std::allocator<long>_>,_std::_Identity<std::__cxx11::list<long,_std::allocator<long>_>_>,_std::less<std::__cxx11::list<long,_std::allocator<long>_>_>,_std::allocator<std::__cxx11::list<long,_std::allocator<long>_>_>_>
      ::~_Rb_tree(&explored_nodes._M_t);
      std::__cxx11::_List_base<long,_std::allocator<long>_>::_M_clear
                (&basics.super__List_base<long,_std::allocator<long>_>);
      iVar9 = 0;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Error: target present in numbers to operate.")
      ;
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar9 = -4;
    }
  }
LAB_001064f4:
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&basics_v.super__Vector_base<long,_std::allocator<long>_>);
  return iVar9;
}

Assistant:

int main(int argc, char *argv[])
{
	vector<long> basics_v;
	char *endptr;
	long number;
	
	// Check number of arguments.
	if (argc < 4) {
		cerr << "Usage: " << argv[0] << " num num... target" << endl;
		return -1;
	}

	// Get number list, checking argument format.
	for (int ii = 1; ii < argc; ++ii) {
		number = strtol(argv[ii], &endptr, 0);

		if (endptr != argv[ii] + strlen(argv[ii])) {
			cerr << "Error: \"" << argv[ii] << "\" not a number."
									<< endl;
			return -2;
		}
		
		if (number <= 0) {
			cerr << "Error: numbers below or equal to zero are not "
							     "allowed." << endl;
			return -3;
		}

		basics_v.push_back(number);
	}

	// Separate target.
	long target = basics_v.back();
	basics_v.pop_back();

	// Check target not in numbers.
	if (find(basics_v.begin(), basics_v.end(), target) != basics_v.end()) {
		cerr << "Error: target present in numbers to operate." << endl;
		return -4;
	}

	// Sort initial numbers and change to list.
	sort(basics_v.begin(), basics_v.end(), greater<long>());
	list<long> basics(basics_v.begin(), basics_v.end());

	// Execution.
	MemoryManager *mm = MemoryManager::instance();
	set<list<long> > explored_nodes;
	clock_t before = clock();
	Node *root = mm->build_node(list<const Operation *>(), 0L, target,
				    basics, explored_nodes, 0);
	clock_t after = clock();
	
	// Print results.
	cout << root->best();
	double clocks = static_cast<double>(after - before);
	double cps = static_cast<double>(CLOCKS_PER_SEC);
	cout << "Elapsed time: " << (clocks / cps) << " seconds" << endl;
	cout << "Explored nodes: " << explored_nodes.size() << endl;

	// Free memory.
	mm->free();
		
	return 0;
}